

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::UInt32Value::_InternalSerialize
          (UInt32Value *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  byte *pbVar5;
  
  uVar2 = (this->field_0)._impl_.value_;
  if (uVar2 != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar2 = (this->field_0)._impl_.value_;
    }
    *target = '\b';
    pbVar5 = target + 1;
    if (uVar2 < 0x80) {
      uVar4 = (ulong)uVar2;
    }
    else {
      uVar4 = (ulong)uVar2;
      do {
        *pbVar5 = (byte)uVar2 | 0x80;
        uVar4 = uVar4 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar2;
        uVar2 = (uint)uVar4;
      } while (bVar1);
    }
    *pbVar5 = (byte)uVar4;
    target = pbVar5 + 1;
  }
  uVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    puVar3 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* UInt32Value::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const UInt32Value& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UInt32Value)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          // uint32 value = 1;
          if (this_._internal_value() != 0) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
                1, this_._internal_value(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UInt32Value)
          return target;
        }